

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTest.cpp
# Opt level: O1

void __thiscall ParseErrorHandler::warning(ParseErrorHandler *this,SAXParseException *e)

{
  FILE *__stream;
  char *pcVar1;
  wchar16 *pwVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  SAXParseException *this_00;
  char *systemId;
  char *message;
  char *local_40;
  char *local_38;
  
  pwVar2 = (wchar16 *)xercesc_4_0::SAXParseException::getSystemId();
  local_40 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar2 = (wchar16 *)(**(code **)(*(long *)e + 0x10))(e);
  local_38 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar1 = local_40;
  __stream = _stderr;
  uVar3 = xercesc_4_0::SAXParseException::getLineNumber();
  uVar4 = xercesc_4_0::SAXParseException::getColumnNumber();
  fprintf(__stream,"\nWarning at file \"%s\", line %llu, char %llu:  %s\n",pcVar1,uVar3,uVar4,
          local_38);
  xercesc_4_0::XMLString::release(&local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&local_38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  this_00 = (SAXParseException *)__cxa_allocate_exception(0x38);
  xercesc_4_0::SAXParseException::SAXParseException(this_00,e);
  __cxa_throw(this_00,&xercesc_4_0::SAXParseException::typeinfo,
              xercesc_4_0::SAXParseException::~SAXParseException);
}

Assistant:

void ParseErrorHandler::warning(const SAXParseException& e)
{
    char* systemId = XMLString::transcode(e.getSystemId());
    char* message = XMLString::transcode(e.getMessage());

    fprintf(stderr, "\nWarning at file \"%s\", line %llu, char %llu:  %s\n",
            systemId, (unsigned long long) e.getLineNumber(),
            (unsigned long long) e.getColumnNumber(), message);

    XMLString::release(&systemId);
    XMLString::release(&message);
    throw e;

}